

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O3

void __thiscall sing::HttpContext::HttpContext(HttpContext *this,int fd)

{
  _Rb_tree_header *p_Var1;
  
  this->fd = fd;
  this->working = false;
  Buffer::Buffer(&this->input);
  Buffer::Buffer(&this->output);
  this->state = REQUEST_LINE;
  (this->request).method = Invalid;
  (this->request).version = Unknown;
  (this->request).path._M_dataplus._M_p = (pointer)&(this->request).path.field_2;
  (this->request).path._M_string_length = 0;
  (this->request).path.field_2._M_local_buf[0] = '\0';
  (this->request).query._M_dataplus._M_p = (pointer)&(this->request).query.field_2;
  (this->request).query._M_string_length = 0;
  (this->request).query.field_2._M_local_buf[0] = '\0';
  (this->request).receiveTime.__d.__r = 0;
  p_Var1 = &(this->request).headers._M_t._M_impl.super__Rb_tree_header;
  (this->request).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->request).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->request).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->request).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->request).headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->response).closeConn = false;
  p_Var1 = &(this->response).headers._M_t._M_impl.super__Rb_tree_header;
  (this->response).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->response).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->response).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->response).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->response).headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->response).code = Unknown;
  (this->response).statusMessage._M_dataplus._M_p = (pointer)&(this->response).statusMessage.field_2
  ;
  (this->response).statusMessage._M_string_length = 0;
  (this->response).statusMessage.field_2._M_local_buf[0] = '\0';
  (this->response).body._M_dataplus._M_p = (pointer)&(this->response).body.field_2;
  (this->response).body._M_string_length = 0;
  (this->response).body.field_2._M_local_buf[0] = '\0';
  (this->response).srcDir._M_dataplus._M_p = (pointer)&(this->response).srcDir.field_2;
  (this->response).srcDir._M_string_length = 0;
  (this->response).srcDir.field_2._M_local_buf[0] = '\0';
  (this->response).path._M_dataplus._M_p = (pointer)&(this->response).path.field_2;
  (this->response).path._M_string_length = 0;
  (this->response).path.field_2._M_local_buf[0] = '\0';
  memset(&(this->response).mmFile,0,0xa8);
  if (-1 < fd) {
    return;
  }
  __assert_fail("fd>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MisakiOfScut[P]SingHttpServer/src/Http/HttpContext.cpp"
                ,9,"sing::HttpContext::HttpContext(int)");
}

Assistant:

HttpContext::HttpContext(int fd)
    :state(REQUEST_LINE),fd(fd),working(false){
    assert(fd>=0);
}